

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckLink(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  ctmbstr ptVar4;
  AttVal *pAVar5;
  ctmbstr cp;
  char *pcVar6;
  
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) &&
     (pAVar5 = node->attributes, pAVar5 != (AttVal *)0x0)) {
    bVar2 = false;
    bVar1 = false;
    do {
      if (((pAVar5->dict != (Attribute *)0x0) && (pAVar5->dict->id == TidyAttr_REL)) &&
         (pcVar6 = pAVar5->value, pcVar6 != (char *)0x0)) {
        do {
          if (*pcVar6 == '\0') goto LAB_00155a7f;
          BVar3 = prvTidyIsWhite((int)*pcVar6);
          pcVar6 = pcVar6 + 1;
        } while (BVar3 != no);
        if (pAVar5->value != (ctmbstr)0x0) {
          ptVar4 = prvTidytmbsubstr(pAVar5->value,"stylesheet");
          if (ptVar4 != (ctmbstr)0x0) {
            bVar1 = true;
          }
        }
      }
LAB_00155a7f:
      if (((pAVar5->dict != (Attribute *)0x0) && (pAVar5->dict->id == TidyAttr_TYPE)) &&
         (pcVar6 = pAVar5->value, pcVar6 != (char *)0x0)) {
        do {
          if (*pcVar6 == '\0') goto LAB_00155ab4;
          BVar3 = prvTidyIsWhite((int)*pcVar6);
          pcVar6 = pcVar6 + 1;
        } while (BVar3 != no);
        bVar2 = true;
      }
LAB_00155ab4:
      pAVar5 = pAVar5->next;
    } while (pAVar5 != (AttVal *)0x0);
    if (bVar2 && bVar1) {
      prvTidyReportAccessError(doc,node,0x2d0);
      return;
    }
  }
  return;
}

Assistant:

static void CheckLink( TidyDocImpl* doc, Node* node )
{
    Bool HasRel = no;
    Bool HasType = no;

    if (Level1_Enabled( doc ))
    {
        AttVal* av;
        /* Check for valid 'REL' and 'TYPE' attribute */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsREL(av) && hasValue(av) )
            {
                if (AttrContains(av, "stylesheet"))
                    HasRel = yes;
            }

            if ( attrIsTYPE(av) && hasValue(av) )
            {
                HasType = yes;
            }
        }

        if (HasRel && HasType)
            TY_(ReportAccessError)( doc, node, STYLESHEETS_REQUIRE_TESTING_LINK );
    }
}